

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O0

void KDict_Add(KonohaContext *kctx,KDict *dict,KKeyValue *kvs)

{
  KonohaStack *pKVar1;
  KonohaContext *kctx_00;
  KDict *in_RDX;
  KonohaContext *in_RSI;
  size_t size;
  KDict *in_stack_ffffffffffffffd8;
  
  kctx_00 = (KonohaContext *)(in_RSI->safepoint >> 4);
  KDict_Ensure(in_RSI,in_RDX,(size_t)kctx_00);
  pKVar1 = in_RSI->esp;
  pKVar1[(long)kctx_00].field_0 =
       (anon_union_8_26_cfe26cc0_for_KonohaValueVar_0)(in_RDX->data).bytesize;
  pKVar1[(long)kctx_00].field_1 =
       *(anon_union_8_10_3f923e25_for_KonohaValueVar_2 *)&(in_RDX->data).field_1;
  in_RSI->safepoint = in_RSI->safepoint + 0x10;
  if (8 < (ulong)((long)kctx_00 - (long)in_RSI->klib)) {
    KDict_Sort(kctx_00,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

KLIBDECL void KDict_Add(KonohaContext *kctx, KDict *dict, KKeyValue *kvs)
{
	size_t size = KDict_size(dict);
	KDict_Ensure(kctx, dict, 1);
	memcpy(dict->data.keyValueItems + size, kvs, sizeof(KKeyValue));
	dict->data.bytesize += sizeof(KKeyValue);
	if(size - dict->sortedData > 8) {
		KDict_Sort(kctx, dict);
	}
}